

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O0

shared_ptr<vmips::Instruction> __thiscall
vmips::Memory::create<vmips::lw>
          (Memory *this,shared_ptr<vmips::VirtReg> *target,
          shared_ptr<vmips::MemoryLocation> *location)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<vmips::Instruction> sVar1;
  shared_ptr<vmips::VirtReg> local_30;
  shared_ptr<vmips::MemoryLocation> *local_20;
  shared_ptr<vmips::MemoryLocation> *location_local;
  shared_ptr<vmips::VirtReg> *target_local;
  
  local_20 = location;
  location_local = (shared_ptr<vmips::MemoryLocation> *)target;
  target_local = (shared_ptr<vmips::VirtReg> *)this;
  std::make_shared<vmips::lw,std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::MemoryLocation>>
            (&local_30,(shared_ptr<vmips::MemoryLocation> *)target);
  std::shared_ptr<vmips::Instruction>::shared_ptr<vmips::lw,void>
            ((shared_ptr<vmips::Instruction> *)this,(shared_ptr<vmips::lw> *)&local_30);
  std::shared_ptr<vmips::lw>::~shared_ptr((shared_ptr<vmips::lw> *)&local_30);
  sVar1.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_Instruction;
  return (shared_ptr<vmips::Instruction>)
         sVar1.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Instruction>
    Memory::create(std::shared_ptr<VirtReg> target, std::shared_ptr<MemoryLocation> location) {
        return std::make_shared<T>(std::move(target), std::move(location));
    }